

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_frEfr.cpp
# Opt level: O3

void DronePoseLib::ValtonenOrnhagArxiv2021::fast_eigenvector_solver
               (double *eigv,int neig,Matrix<double,_11,_11,_0,_11,_11> *AM,MatrixXcd *sols)

{
  complex<double> *pcVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  Index alignedStart;
  Matrix3d AA;
  Vector2d s;
  Matrix<double,_3,_11,_0,_3,_11> AMs;
  assign_op<double,_double> local_4a9;
  size_t local_4a8;
  double **local_4a0;
  double **local_498;
  long local_490;
  ulong local_488;
  double local_480;
  double local_478;
  double local_470;
  double local_468;
  long local_460;
  double local_458;
  double local_450;
  double local_448;
  double local_440;
  double local_438;
  double local_430;
  double local_428;
  double *local_420;
  SrcXprType local_418;
  double *local_408;
  double dStack_400;
  double local_3f8;
  double local_3f0;
  double dStack_3e8;
  double local_3e0;
  double local_3d8;
  double dStack_3d0;
  double local_3c8;
  double local_3b8;
  double dStack_3b0;
  double local_3a8;
  double dStack_3a0;
  double local_398;
  double dStack_390;
  double local_388;
  double dStack_380;
  double local_378;
  double dStack_370;
  double local_368;
  double dStack_360;
  double local_358;
  double dStack_350;
  double local_348;
  double dStack_340;
  double local_338;
  double dStack_330;
  double local_328;
  double dStack_320;
  double local_318;
  double dStack_310;
  double local_308;
  undefined8 uStack_300;
  Matrix<double,_2,_1,_0,_2,_1> local_2f8;
  double local_2e0 [5];
  double local_2b8 [33];
  double *local_1b0 [2];
  double **local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_168;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,__1,_0,_3,_3>_> local_160;
  
  lVar3 = 0;
  do {
    lVar4 = (long)*(int *)((long)fast_eigenvector_solver::ind + lVar3);
    *(double *)((long)local_2b8 + lVar3 * 2) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar4];
    *(double *)((long)local_2b8 + lVar3 * 2 + 0x18) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar4 + 0xb];
    *(double *)((long)local_2b8 + lVar3 * 2 + 0x30) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar4 + 0x16];
    *(double *)((long)local_2b8 + lVar3 * 2 + 0x48) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar4 + 0x21];
    *(double *)((long)local_2b8 + lVar3 * 2 + 0x60) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar4 + 0x2c];
    *(double *)((long)local_2b8 + lVar3 * 2 + 0x78) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar4 + 0x37];
    *(double *)((long)local_1b0 + lVar3 * 2 + -0x78) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar4 + 0x42];
    *(double *)((long)local_1b0 + lVar3 * 2 + -0x60) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar4 + 0x4d];
    *(double *)((long)local_1b0 + lVar3 * 2 + -0x48) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar4 + 0x58];
    *(double *)((long)local_1b0 + lVar3 * 2 + -0x30) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar4 + 99];
    *(double *)((long)local_1b0 + lVar3 * 2 + -0x18) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar4 + 0x6e];
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  if (0 < neig) {
    local_318 = local_2b8[0];
    dStack_310 = local_2b8[1];
    local_328 = local_2b8[6];
    dStack_320 = local_2b8[7];
    local_338 = local_2b8[0xc];
    dStack_330 = local_2b8[0xd];
    local_428 = local_2b8[2];
    local_430 = local_2b8[8];
    local_438 = local_2b8[0xe];
    local_348 = local_2b8[3];
    dStack_340 = local_2b8[4];
    local_358 = local_2b8[9];
    dStack_350 = local_2b8[10];
    local_368 = local_2b8[0x12];
    dStack_360 = local_2b8[0x13];
    local_378 = local_2b8[0x18];
    dStack_370 = local_2b8[0x19];
    local_440 = local_2b8[5];
    local_448 = local_2b8[0xb];
    local_450 = local_2b8[0x14];
    local_458 = local_2b8[0x1a];
    local_388 = local_2b8[0xf];
    dStack_380 = local_2b8[0x10];
    local_398 = local_2b8[0x15];
    dStack_390 = local_2b8[0x16];
    local_460 = 0;
    local_498 = local_1b0;
    local_4a0 = &local_408;
    local_4a8 = 0x30;
    local_488 = (ulong)(uint)neig;
    uVar5 = 0;
    local_490 = 0x30;
    local_3a8 = local_2b8[0x1b];
    dStack_3a0 = local_2b8[0x1c];
    local_3b8 = local_2b8[0x1e];
    dStack_3b0 = local_2b8[0x1f];
    local_468 = local_2b8[0x11];
    local_470 = local_2b8[0x17];
    local_478 = local_2b8[0x1d];
    local_480 = local_2b8[0x20];
    local_420 = eigv;
    do {
      local_308 = local_420[uVar5];
      lVar3 = 0;
      dVar2 = local_308;
      do {
        dVar2 = dVar2 * local_308;
        local_2e0[lVar3] = dVar2;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      dStack_400 = local_2e0[0] * dStack_330 + local_2e0[1] * dStack_320 + local_2e0[2] * dStack_310
      ;
      local_3f8 = local_2e0[0] * local_438 + local_2e0[1] * local_430 + local_2e0[2] * local_428;
      local_3f0 = local_308 * local_378 +
                  local_2e0[0] * local_368 + local_2e0[1] * local_358 + local_2e0[2] * local_348;
      local_3c8 = (local_308 * local_478 + local_2e0[0] * local_470 + local_2e0[1] * local_468 +
                  local_480) - local_2e0[2];
      uStack_300 = 0;
      local_3e0 = local_308 * local_458 +
                  local_2e0[0] * local_450 + local_2e0[1] * local_448 + local_2e0[2] * local_440;
      local_3d8 = local_308 * local_3a8 + local_2e0[0] * local_398 + local_2e0[1] * local_388 +
                  local_3b8;
      dStack_3d0 = local_308 * dStack_3a0 + local_2e0[0] * dStack_390 + local_2e0[1] * dStack_380 +
                   dStack_3b0;
      local_408 = (double *)
                  ((local_2e0[0] * local_338 + local_2e0[1] * local_328 + local_2e0[2] * local_318)
                  - local_2e0[3]);
      dStack_3e8 = (local_308 * dStack_370 +
                   local_2e0[0] * dStack_360 + local_2e0[1] * dStack_350 + local_2e0[2] * dStack_340
                   ) - local_2e0[3];
      local_168 = 2;
      if (local_460 == 0) {
        memcpy(local_498,local_4a0,local_4a8);
      }
      else {
        local_1b0[0] = local_408;
        memcpy(local_498,local_4a0,local_4a8);
        *(undefined8 *)((long)local_1b0 + local_490) = *(undefined8 *)((long)&local_408 + local_490)
        ;
      }
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,-1,0,3,3>>::
      ColPivHouseholderQR<Eigen::Matrix<double,3,_1,0,3,3>>
                ((ColPivHouseholderQR<Eigen::Matrix<double,3,_1,0,3,3>> *)&local_160,
                 (EigenBase<Eigen::Matrix<double,_3,__1,_0,_3,_3>_> *)local_1b0);
      local_1b0[0] = &local_3d8;
      local_1a0 = &local_408;
      local_198 = 0;
      local_190 = 2;
      local_188 = 3;
      if (local_160.m_isInitialized == false) {
        __assert_fail("derived().m_isInitialized && \"Solver is not initialized.\"",
                      "/usr/include/eigen3/Eigen/src/Core/SolverBase.h",0x96,
                      "void Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 3, -1, 0, 3, 3>>>::_check_solve_assertion(const Rhs &) const [Derived = Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 3, -1, 0, 3, 3>>, Transpose_ = false, Rhs = Eigen::MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1, true>>>]"
                     );
      }
      local_418.m_dec = &local_160;
      local_418.m_rhs =
           (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
            *)local_1b0;
      if (local_160.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,__1,_0,_3,_3>_>.m_storage.
          m_cols != 2) {
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, 2, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 2, 1>]"
                     );
      }
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_-1,_0,_3,_3>_>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(&local_2f8,&local_418,&local_4a9);
      lVar3 = (sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_>)
              .m_storage.m_rows;
      if ((lVar3 < 1) ||
         ((sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols <= (long)uVar5)) {
LAB_0016046d:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<std::complex<double>, -1, -1>, Level = 1]"
                     );
      }
      pcVar1 = (sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_>
               ).m_storage.m_data;
      lVar3 = lVar3 * uVar5;
      *(double *)pcVar1[lVar3]._M_value = local_308;
      *(undefined8 *)(pcVar1[lVar3]._M_value + 8) = 0;
      lVar3 = (sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_>)
              .m_storage.m_rows;
      if ((lVar3 < 2) ||
         ((sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols <= (long)uVar5)) goto LAB_0016046d;
      pcVar1 = (sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_>
               ).m_storage.m_data;
      lVar3 = lVar3 * uVar5;
      *(double *)pcVar1[lVar3 + 1]._M_value =
           local_2f8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
           array[1];
      *(undefined8 *)(pcVar1[lVar3 + 1]._M_value + 8) = 0;
      uVar5 = uVar5 + 1;
    } while (uVar5 != local_488);
  }
  return;
}

Assistant:

inline void fast_eigenvector_solver(
    double *eigv,
    int neig,
    const Eigen::Matrix<double, 11, 11> &AM,
    Eigen::MatrixXcd *sols) {
    static const int ind[] = {0, 1, 5};
    // Truncated action matrix containing non-trivial rows
    Eigen::Matrix<double, 3, 11> AMs;
    double zi[5];

    for (int i = 0; i < 3; i++) {
        AMs.row(i) = AM.row(ind[i]);
    }
    for (int i = 0; i < neig; i++) {
        zi[0] = eigv[i];
        for (int j = 1; j < 5; j++) {
            zi[j] = zi[j - 1] * eigv[i];
        }
        Eigen::Matrix3d AA;
        AA.col(0) = zi[3] * AMs.col(0) + zi[2] * AMs.col(2) + zi[1] * AMs.col(4);
        AA.col(1) = zi[3] * AMs.col(1) + zi[2] * AMs.col(3) + zi[1] * AMs.col(6) + zi[0] * AMs.col(8);
        AA.col(2) = zi[2] * AMs.col(5) + zi[1] * AMs.col(7) + zi[0] * AMs.col(9) + AMs.col(10);
        AA(0, 0) = AA(0, 0) - zi[4];
        AA(1, 1) = AA(1, 1) - zi[4];
        AA(2, 2) = AA(2, 2) - zi[3];

        Eigen::Vector2d s = AA.leftCols(2).colPivHouseholderQr().solve(-AA.col(2));
        (*sols)(0, i) = zi[0];
        (*sols)(1, i) = s(1);
    }
}